

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

TPZTransform<double> * pzshape::TPZShapeTriang::ParametricTransform(int trans_id)

{
  double *pdVar1;
  TPZFMatrix<double> *col;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> *trans;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<double> *in_stack_ffffffffffffff60;
  TPZFMatrix<double> *this;
  undefined8 in_stack_ffffffffffffff78;
  double dVar2;
  TPZTransform<double> *in_stack_ffffffffffffff80;
  
  TPZTransform<double>::TPZTransform
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78);
  dVar2 = *(double *)(gTrans2dT + (long)in_ESI * 0x20);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  *pdVar1 = dVar2;
  dVar2 = *(double *)(gTrans2dT + (long)in_ESI * 0x20 + 8);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  *pdVar1 = dVar2;
  dVar2 = *(double *)(gTrans2dT + (long)in_ESI * 0x20 + 0x10);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  *pdVar1 = dVar2;
  dVar2 = *(double *)(gTrans2dT + (long)in_ESI * 0x20 + 0x18);
  TPZTransform<double>::Mult(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  *pdVar1 = dVar2;
  this = *(TPZFMatrix<double> **)(gVet2dT + (long)in_ESI * 0x10);
  TPZTransform<double>::Sum(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  *pdVar1 = (double)this;
  dVar2 = *(double *)(gVet2dT + (long)in_ESI * 0x10 + 8);
  col = TPZTransform<double>::Sum(in_RDI);
  pdVar1 = TPZFMatrix<double>::operator()(this,(int64_t)pdVar1,(int64_t)col);
  *pdVar1 = dVar2;
  return in_RDI;
}

Assistant:

TPZTransform<REAL>  TPZShapeTriang::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dT[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dT[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dT[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dT[trans_id][1][1];
        trans.Sum()(0,0) =gVet2dT[trans_id][0];
        trans.Sum()(1,0) =gVet2dT[trans_id][1];
        return trans;
        
    }